

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O3

void sort_rec3(float *array,int *perm,int size)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int *perm_00;
  float *array_00;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (0xf < size) {
    do {
      uVar9 = size;
      array_00 = array;
      perm_00 = perm;
      fVar1 = array_00[uVar9 >> 1];
      lVar12 = -1;
      uVar5 = (ulong)uVar9;
      while( true ) {
        iVar11 = (int)lVar12;
        lVar6 = (long)iVar11;
        lVar14 = 0;
        lVar13 = 0;
        do {
          fVar2 = array_00[lVar6 + lVar14 + 1];
          lVar13 = lVar13 + -4;
          lVar14 = lVar14 + 1;
        } while (fVar2 < fVar1);
        uVar5 = (ulong)(int)uVar5;
        lVar12 = lVar6 + lVar14;
        do {
          lVar4 = uVar5 - 1;
          uVar5 = uVar5 - 1;
        } while (fVar1 < array_00[lVar4]);
        if ((long)uVar5 <= lVar12) break;
        array_00[lVar6 + lVar14] = array_00[lVar4];
        array_00[uVar5] = fVar2;
        iVar11 = perm_00[lVar6 + lVar14];
        perm_00[lVar6 + lVar14] = perm_00[uVar5];
        perm_00[uVar5] = iVar11;
      }
      iVar3 = (int)lVar14;
      sort_rec3(array_00,perm_00,iVar11 + iVar3);
      size = (uVar9 - iVar11) - iVar3;
      perm = (int *)((long)perm_00 + ((long)iVar11 * 4 - lVar13));
      array = (float *)((long)array_00 + ((long)iVar11 * 4 - lVar13));
    } while (0xf < size);
    perm = (int *)((long)perm_00 + ((long)iVar11 * 4 - lVar13));
    size = (uVar9 - iVar11) - iVar3;
    array = (float *)((long)array_00 + ((long)iVar11 * 4 - lVar13));
  }
  if (1 < size) {
    uVar7 = 1;
    uVar5 = 0;
    do {
      uVar10 = uVar5 & 0xffffffff;
      uVar8 = uVar7;
      do {
        uVar9 = (uint)uVar8;
        if (array[(int)(uint)uVar10] < array[uVar8] || array[(int)(uint)uVar10] == array[uVar8]) {
          uVar9 = (uint)uVar10;
        }
        uVar8 = uVar8 + 1;
        uVar10 = (ulong)uVar9;
      } while ((uint)size != uVar8);
      fVar1 = array[uVar5];
      array[uVar5] = array[(int)uVar9];
      array[(int)uVar9] = fVar1;
      iVar11 = perm[uVar5];
      perm[uVar5] = perm[(int)uVar9];
      uVar5 = uVar5 + 1;
      perm[(int)uVar9] = iVar11;
      uVar7 = uVar7 + 1;
    } while (uVar5 != size - 1);
  }
  return;
}

Assistant:

static void sort_rec3(float* array, int* perm, int size)
{
    if (size <= 15)
        selectionsort3(array, perm, size);
    else{
        float  pivot = array[size/2];
        float  tmpf;
        int    tmpi;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmpf = array[i]; array[i] = array[j]; array[j] = tmpf;
            tmpi = perm[i];  perm[i]  = perm[j];  perm[j]  = tmpi;
        }
        sort_rec3(array    , perm,     i     );
        sort_rec3(&array[i], &perm[i], size-i);
    }
}